

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void aom_highbd_upsampled_pred_c
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,int ref_stride,
               int bd,int subpel_search)

{
  int_interpfilters block_height;
  int iVar1;
  scale_factors *psVar2;
  InterpFilterParams *filter_params;
  int16_t *piVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  MACROBLOCKD *in_RDI;
  long in_R9;
  int_interpfilters in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000040;
  int intermediate_height;
  int16_t *kernel_y;
  int16_t *kernel_x;
  uint16_t temp [20480];
  int16_t *kernel_1;
  int16_t *kernel;
  int i;
  uint16_t *comp_pred;
  uint16_t *ref;
  InterpFilterParams *filter;
  int_interpfilters filters;
  InterPredParams inter_pred_params;
  buf_2d *pre_buf;
  buf_2d *dst_buf;
  macroblockd_plane *pd;
  int mi_y;
  int mi_x;
  int plane;
  int is_scaled;
  scale_factors *sf;
  int is_intrabc;
  int ref_num;
  MB_MODE_INFO *mi;
  undefined8 in_stack_ffffffffffff5db8;
  undefined4 uVar4;
  InterPredParams *inter_pred_params_00;
  undefined4 in_stack_ffffffffffff5dc0;
  undefined4 in_stack_ffffffffffff5dc4;
  int in_stack_ffffffffffff5dcc;
  int in_stack_ffffffffffff5dd0;
  int iVar5;
  int in_stack_ffffffffffff5dd4;
  undefined8 in_stack_ffffffffffff5de0;
  undefined4 in_stack_ffffffffffff5de8;
  int in_stack_ffffffffffff5dec;
  ptrdiff_t in_stack_ffffffffffff5df0;
  InterPredParams *inter_pred_params_01;
  undefined4 in_stack_ffffffffffff5df8;
  undefined4 in_stack_ffffffffffff5dfc;
  undefined4 in_stack_ffffffffffff5e00;
  undefined4 in_stack_ffffffffffff5e04;
  undefined4 in_stack_ffffffffffff5e08;
  undefined4 in_stack_ffffffffffff5e0c;
  int in_stack_ffffffffffff5e20;
  undefined4 in_stack_ffffffffffff5e24;
  int in_stack_ffffffffffff5e28;
  int iVar6;
  int iVar7;
  scale_factors *in_stack_ffffffffffff5e30;
  int in_stack_ffffffffffff5e38;
  undefined4 in_stack_ffffffffffff5e3c;
  int in_stack_ffffffffffff5e40;
  int local_1b4;
  void *local_1b0;
  void *local_1a8;
  undefined1 local_190 [96];
  undefined1 auStack_130 [184];
  macroblockd_plane *local_78;
  int local_70;
  int local_6c;
  undefined4 local_68;
  int local_64;
  scale_factors *local_60;
  int local_58;
  undefined4 local_54;
  MB_MODE_INFO *local_50;
  long local_48;
  int local_38;
  int local_34;
  long local_30;
  MACROBLOCKD *local_28;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffff5de0 >> 0x20);
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffff5db8 >> 0x20);
  local_48 = in_R9;
  if (in_RDI != (MACROBLOCKD *)0x0) {
    local_50 = *in_RDI->mi;
    local_54 = 0;
    local_38 = in_ECX;
    local_34 = in_EDX;
    local_30 = in_RSI;
    local_28 = in_RDI;
    local_58 = is_intrabc_block(local_50);
    if (local_58 == 0) {
      psVar2 = local_28->block_ref_scale_factors[0];
    }
    else {
      psVar2 = (scale_factors *)(local_30 + 0x110);
    }
    local_60 = psVar2;
    local_64 = av1_is_scaled((scale_factors *)
                             CONCAT44(in_stack_ffffffffffff5dc4,in_stack_ffffffffffff5dc0));
    iVar7 = (int)psVar2;
    if (local_64 != 0) {
      local_68._0_1_ = BLOCK_4X4;
      local_68._1_3_ = 0;
      local_6c = local_38 << 2;
      local_70 = local_34 << 2;
      local_78 = local_28->plane;
      auStack_130._176_8_ = &local_28->plane[0].dst;
      psVar2 = (scale_factors *)auStack_130._176_8_;
      if (local_58 == 0) {
        psVar2 = (scale_factors *)local_28->plane[0].pre;
      }
      inter_pred_params_01 = (InterPredParams *)auStack_130;
      auStack_130._168_8_ = psVar2;
      get_conv_params(in_stack_ffffffffffff5dd4,in_stack_ffffffffffff5dd0,in_stack_ffffffffffff5dcc)
      ;
      iVar6 = (int)psVar2;
      memcpy(inter_pred_params_01,local_190,0x30);
      block_height = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      iVar5 = local_78->subsampling_y;
      iVar1 = local_28->bd;
      is_cur_buf_hbd(local_28);
      inter_pred_params_00 = (InterPredParams *)CONCAT44(uVar4,iVar5);
      iVar5 = local_58;
      av1_init_inter_params
                (inter_pred_params_01,in_stack_ffffffffffff5dec,block_height.as_int,
                 SUB84(auStack_130._168_8_,4),(int)auStack_130._168_8_,
                 (int)((ulong)local_60 >> 0x20),iVar6,iVar7,in_stack_ffffffffffff5e20,
                 in_stack_ffffffffffff5e28,in_stack_ffffffffffff5e30,
                 (buf_2d *)CONCAT44(in_stack_ffffffffffff5e3c,in_stack_ffffffffffff5e38),
                 in_stack_00000008);
      av1_enc_build_one_inter_predictor
                ((uint8_t *)CONCAT44(in_stack_ffffffffffff5dd4,iVar5),in_stack_ffffffffffff5dcc,
                 (MV *)CONCAT44(in_stack_ffffffffffff5dc4,iVar1),inter_pred_params_00);
      return;
    }
    local_64 = 0;
  }
  iVar7 = (int)in_stack_ffffffffffff5e30;
  filter_params = av1_get_filter(in_stack_00000040);
  if ((in_stack_00000018 == 0) && (in_stack_00000020 == 0)) {
    local_1a8 = (void *)(in_stack_00000028 << 1);
    local_1b0 = (void *)(local_48 << 1);
    for (local_1b4 = 0; local_1b4 < in_stack_00000010; local_1b4 = local_1b4 + 1) {
      memcpy(local_1b0,local_1a8,(long)(int)in_stack_00000008.as_int << 1);
      local_1b0 = (void *)((long)local_1b0 + (long)(int)in_stack_00000008.as_int * 2);
      local_1a8 = (void *)((long)local_1a8 + (long)in_stack_00000030 * 2);
    }
  }
  else if (in_stack_00000020 == 0) {
    av1_get_interp_filter_subpel_kernel(filter_params,in_stack_00000018 << 1);
    aom_highbd_convolve8_horiz_c
              ((uint8_t *)CONCAT44(in_stack_ffffffffffff5e0c,in_stack_ffffffffffff5e08),
               CONCAT44(in_stack_ffffffffffff5e04,in_stack_ffffffffffff5e00),
               (uint8_t *)CONCAT44(in_stack_ffffffffffff5dfc,in_stack_ffffffffffff5df8),
               in_stack_ffffffffffff5df0,
               (int16_t *)CONCAT44(in_stack_ffffffffffff5dec,in_stack_ffffffffffff5de8),iVar5,
               (int16_t *)CONCAT44(in_stack_ffffffffffff5e24,in_stack_ffffffffffff5e20),
               in_stack_ffffffffffff5e28,iVar7,in_stack_ffffffffffff5e38,in_stack_ffffffffffff5e40);
  }
  else if (in_stack_00000018 == 0) {
    av1_get_interp_filter_subpel_kernel(filter_params,in_stack_00000020 << 1);
    aom_highbd_convolve8_vert_c
              ((uint8_t *)CONCAT44(in_stack_ffffffffffff5e0c,in_stack_ffffffffffff5e08),
               CONCAT44(in_stack_ffffffffffff5e04,in_stack_ffffffffffff5e00),
               (uint8_t *)CONCAT44(in_stack_ffffffffffff5dfc,in_stack_ffffffffffff5df8),
               in_stack_ffffffffffff5df0,
               (int16_t *)CONCAT44(in_stack_ffffffffffff5dec,in_stack_ffffffffffff5de8),iVar5,
               (int16_t *)CONCAT44(in_stack_ffffffffffff5e24,in_stack_ffffffffffff5e20),
               in_stack_ffffffffffff5e28,iVar7,in_stack_ffffffffffff5e38,in_stack_ffffffffffff5e40);
  }
  else {
    piVar3 = av1_get_interp_filter_subpel_kernel(filter_params,in_stack_00000018 << 1);
    iVar7 = (int)piVar3;
    piVar3 = av1_get_interp_filter_subpel_kernel(filter_params,in_stack_00000020 << 1);
    iVar1 = ((in_stack_00000010 + -1) * 8 + in_stack_00000020 >> 3) + (uint)filter_params->taps;
    iVar6 = (int)piVar3;
    aom_highbd_convolve8_horiz_c
              ((uint8_t *)CONCAT44(in_stack_ffffffffffff5e0c,in_stack_ffffffffffff5e08),
               CONCAT44(in_stack_ffffffffffff5e04,in_stack_ffffffffffff5e00),
               (uint8_t *)CONCAT44(in_stack_ffffffffffff5dfc,in_stack_ffffffffffff5df8),
               in_stack_ffffffffffff5df0,
               (int16_t *)CONCAT44(in_stack_ffffffffffff5dec,in_stack_ffffffffffff5de8),iVar5,
               (int16_t *)CONCAT44(iVar1,in_stack_ffffffffffff5e20),iVar6,iVar7,
               in_stack_ffffffffffff5e38,in_stack_ffffffffffff5e40);
    aom_highbd_convolve8_vert_c
              ((uint8_t *)CONCAT44(in_stack_ffffffffffff5e0c,in_stack_ffffffffffff5e08),
               CONCAT44(in_stack_ffffffffffff5e04,in_stack_ffffffffffff5e00),
               (uint8_t *)CONCAT44(in_stack_ffffffffffff5dfc,in_stack_ffffffffffff5df8),
               in_stack_ffffffffffff5df0,
               (int16_t *)CONCAT44(in_stack_ffffffffffff5dec,in_stack_ffffffffffff5de8),iVar5,
               (int16_t *)CONCAT44(iVar1,in_stack_ffffffffffff5e20),iVar6,iVar7,
               in_stack_ffffffffffff5e38,in_stack_ffffffffffff5e40);
  }
  return;
}

Assistant:

void aom_highbd_upsampled_pred_c(MACROBLOCKD *xd,
                                 const struct AV1Common *const cm, int mi_row,
                                 int mi_col, const MV *const mv,
                                 uint8_t *comp_pred8, int width, int height,
                                 int subpel_x_q3, int subpel_y_q3,
                                 const uint8_t *ref8, int ref_stride, int bd,
                                 int subpel_search) {
  // expect xd == NULL only in tests
  if (xd != NULL) {
    const MB_MODE_INFO *mi = xd->mi[0];
    const int ref_num = 0;
    const int is_intrabc = is_intrabc_block(mi);
    const struct scale_factors *const sf =
        is_intrabc ? &cm->sf_identity : xd->block_ref_scale_factors[ref_num];
    const int is_scaled = av1_is_scaled(sf);

    if (is_scaled) {
      int plane = 0;
      const int mi_x = mi_col * MI_SIZE;
      const int mi_y = mi_row * MI_SIZE;
      const struct macroblockd_plane *const pd = &xd->plane[plane];
      const struct buf_2d *const dst_buf = &pd->dst;
      const struct buf_2d *const pre_buf =
          is_intrabc ? dst_buf : &pd->pre[ref_num];

      InterPredParams inter_pred_params;
      inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
      const int_interpfilters filters =
          av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      av1_init_inter_params(
          &inter_pred_params, width, height, mi_y >> pd->subsampling_y,
          mi_x >> pd->subsampling_x, pd->subsampling_x, pd->subsampling_y,
          xd->bd, is_cur_buf_hbd(xd), is_intrabc, sf, pre_buf, filters);
      av1_enc_build_one_inter_predictor(comp_pred8, width, mv,
                                        &inter_pred_params);
      return;
    }
  }

  const InterpFilterParams *filter = av1_get_filter(subpel_search);

  if (!subpel_x_q3 && !subpel_y_q3) {
    const uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
    uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
    for (int i = 0; i < height; i++) {
      memcpy(comp_pred, ref, width * sizeof(*comp_pred));
      comp_pred += width;
      ref += ref_stride;
    }
  } else if (!subpel_y_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    aom_highbd_convolve8_horiz_c(ref8, ref_stride, comp_pred8, width, kernel,
                                 16, NULL, -1, width, height, bd);
  } else if (!subpel_x_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    aom_highbd_convolve8_vert_c(ref8, ref_stride, comp_pred8, width, NULL, -1,
                                kernel, 16, width, height, bd);
  } else {
    DECLARE_ALIGNED(16, uint16_t,
                    temp[((MAX_SB_SIZE + 16) + 16) * MAX_SB_SIZE]);
    const int16_t *const kernel_x =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    const int16_t *const kernel_y =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    const int intermediate_height =
        (((height - 1) * 8 + subpel_y_q3) >> 3) + filter->taps;
    assert(intermediate_height <= (MAX_SB_SIZE * 2 + 16) + 16);
    aom_highbd_convolve8_horiz_c(ref8 - ref_stride * ((filter->taps >> 1) - 1),
                                 ref_stride, CONVERT_TO_BYTEPTR(temp),
                                 MAX_SB_SIZE, kernel_x, 16, NULL, -1, width,
                                 intermediate_height, bd);
    aom_highbd_convolve8_vert_c(
        CONVERT_TO_BYTEPTR(temp + MAX_SB_SIZE * ((filter->taps >> 1) - 1)),
        MAX_SB_SIZE, comp_pred8, width, NULL, -1, kernel_y, 16, width, height,
        bd);
  }
}